

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_right_most_traversal
          (iterator *this,olc_node_ptr node,read_critical_section *parent_critical_section)

{
  atomic<long> *paVar1;
  long lVar2;
  optimistic_lock *this_00;
  ulong uVar3;
  bool bVar4;
  node_type type;
  undefined7 extraout_var;
  bool bVar5;
  undefined1 local_70 [8];
  iter_result t;
  undefined1 local_48 [8];
  read_critical_section node_critical_section;
  
  t.prefix = (key_prefix_snapshot)this;
  bVar4 = optimistic_lock::read_critical_section::check(parent_critical_section);
  if (bVar4) {
    node_critical_section.version.version._4_4_ = (undefined4)CONCAT71(extraout_var,bVar4);
    do {
      if (node.tagged_ptr == 0) {
        __assert_fail("node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0xa2c,
                      "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_right_most_traversal(detail::olc_node_ptr, optimistic_lock::read_critical_section &) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      optimistic_lock::try_read_lock((optimistic_lock *)local_48);
      if (local_48 == (undefined1  [8])0x0) {
LAB_0016c3ea:
        bVar4 = false;
        node_critical_section.version.version._4_4_ = 0;
      }
      else {
        this_00 = parent_critical_section->lock;
        if ((this_00->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_0016c424:
          __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
        }
        if ((parent_critical_section->version).version !=
            (this_00->version).version.super___atomic_base<unsigned_long>._M_i) {
          optimistic_lock::dec_read_lock_count(this_00);
          parent_critical_section->lock = (optimistic_lock *)0x0;
          goto LAB_0016c3ea;
        }
        LOCK();
        paVar1 = &this_00->read_lock_count;
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_0016c443:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
        type = (node_type)node.tagged_ptr & (I256|I48);
        if ((node.tagged_ptr & 7) == 0) {
          bVar4 = try_push_leaf((iterator *)t.prefix,node,(read_critical_section *)local_48);
          if (bVar4) {
            if ((((atomic<long> *)((long)local_48 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_0016c424;
            bVar5 = node_critical_section.lock == *(optimistic_lock **)local_48;
            uVar3 = (ulong)node_critical_section.lock >> 8;
            if (bVar5) {
              LOCK();
              paVar1 = (atomic<long> *)((long)local_48 + 8);
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_0016c443;
            }
            else {
              optimistic_lock::dec_read_lock_count((optimistic_lock *)local_48);
            }
            local_48 = (undefined1  [8])0x0;
            bVar4 = false;
            node_critical_section.version.version._4_4_ = (int)CONCAT71((int7)uVar3,bVar5);
            goto LAB_0016c3ba;
          }
        }
        else {
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::last((iter_result *)local_70,
                 (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                  *)(node.tagged_ptr & 0xfffffffffffffff8),type);
          bVar4 = optimistic_lock::read_critical_section::check((read_critical_section *)local_48);
          if ((bVar4) &&
             (bVar4 = try_push((iterator *)t.prefix,(iter_result *)local_70,
                               (read_critical_section *)local_48), bVar4)) {
            node.tagged_ptr =
                 (uintptr_t)
                 detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                              *)(node.tagged_ptr & 0xfffffffffffffff8),type,t.node.tagged_ptr._1_1_)
            ;
            bVar4 = optimistic_lock::read_critical_section::check((read_critical_section *)local_48)
            ;
            if (bVar4) {
              parent_critical_section->lock = (optimistic_lock *)local_48;
              local_48 = (undefined1  [8])0x0;
              (parent_critical_section->version).version =
                   (version_tag_type)node_critical_section.lock;
              bVar4 = true;
              goto LAB_0016c3ba;
            }
          }
        }
        bVar4 = false;
        node_critical_section.version.version._4_4_ = 0;
      }
LAB_0016c3ba:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)local_48);
    } while (bVar4);
  }
  else {
    node_critical_section.version.version._4_4_ = 0;
  }
  return (bool)((byte)node_critical_section.version.version._4_4_ & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_right_most_traversal(
    detail::olc_node_ptr node,
    optimistic_lock::read_critical_section& parent_critical_section) {
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return false;  // LCOV_EXCL_LINE
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return UNODB_DETAIL_LIKELY(node_critical_section.try_read_unlock());
    }
    // recursive descent.
    auto* const inode{node.ptr<inode_type*>()};
    const auto t =
        inode->last(node_type);  // last child of current internal node
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!try_push(t, node_critical_section)))
      return false;                                     // LCOV_EXCL_LINE
    node = inode->get_child(node_type, t.child_index);  // get child
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }
  UNODB_DETAIL_CANNOT_HAPPEN();
}